

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

string * bloaty::(anonymous_namespace)::DoubleStringPrintf_abi_cxx11_(char *fmt,double d)

{
  char *in_RSI;
  string *in_RDI;
  undefined8 in_XMM0_Qa;
  char buf [1024];
  allocator<char> *in_stack_fffffffffffffbe0;
  char *in_stack_fffffffffffffbe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbf0;
  
  snprintf(&stack0xfffffffffffffbe8,0x400,in_RSI,in_XMM0_Qa);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffbe7);
  return in_RDI;
}

Assistant:

std::string DoubleStringPrintf(const char* fmt, double d) {
  char buf[1024];
  snprintf(buf, sizeof(buf), fmt, d);
  return std::string(buf);
}